

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_0::LineCompositeTask::LineCompositeTask
          (LineCompositeTask *this,TaskGroup *group,Data *data,int y,int start,
          vector<const_char_*,_std::allocator<const_char_*>_> *names,
          vector<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>,_std::allocator<std::vector<std::vector<float_*,_std::allocator<float_*>_>,_std::allocator<std::vector<float_*,_std::allocator<float_*>_>_>_>_>_>
          *pointers,vector<unsigned_int,_std::allocator<unsigned_int>_> *total_sizes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *num_sources)

{
  undefined4 in_ECX;
  _func_int **in_RDX;
  Task *in_RDI;
  undefined4 in_R8D;
  _func_int **in_R9;
  TaskGroup *in_stack_00000008;
  TaskGroup *in_stack_ffffffffffffffc8;
  
  IlmThread_3_3::Task::Task(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_Task = (_func_int **)&PTR__LineCompositeTask_004b6898;
  in_RDI[1]._vptr_Task = in_RDX;
  *(undefined4 *)&in_RDI[1]._group = in_ECX;
  *(undefined4 *)((long)&in_RDI[1]._group + 4) = in_R8D;
  in_RDI[2]._vptr_Task = in_R9;
  in_RDI[2]._group = in_stack_00000008;
  in_RDI[3]._vptr_Task = (_func_int **)names;
  in_RDI[3]._group = (TaskGroup *)CONCAT44(y,start);
  return;
}

Assistant:

LineCompositeTask (
        TaskGroup*                      group,
        CompositeDeepScanLine::Data*    data,
        int                             y,
        int                             start,
        vector<const char*>*            names,
        vector<vector<vector<float*>>>* pointers,
        vector<unsigned int>*           total_sizes,
        vector<unsigned int>*           num_sources)
        : Task (group)
        , _Data (data)
        , _y (y)
        , _start (start)
        , _names (names)
        , _pointers (pointers)
        , _total_sizes (total_sizes)
        , _num_sources (num_sources)
    {}